

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_crc32.c
# Opt level: O3

void csp_crc32_update(csp_crc32_t *crc,void *data,uint32_t length)

{
  uint uVar1;
  long lVar2;
  uint8_t *data8;
  
  if (length != 0 && crc != (csp_crc32_t *)0x0) {
    uVar1 = *crc;
    lVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crc_tab[(byte)(*(byte *)((long)data + lVar2) ^ (byte)uVar1)];
      *crc = uVar1;
      lVar2 = lVar2 + 1;
    } while (length != (uint32_t)lVar2);
  }
  return;
}

Assistant:

void csp_crc32_update(csp_crc32_t * crc, const void * data, uint32_t length) {

	const uint8_t * data8 = (uint8_t*)data;

	if (crc) {
		while (length--) {
#ifdef __AVR__
			crc = pgm_read_dword(&crc_tab[(crc ^ *data8++) & 0xFFL]) ^ (crc >> 8);
#else
			(*crc) = crc_tab[((*crc) ^ *data8++) & 0xFFL] ^ ((*crc) >> 8);
#endif
		}
	}
}